

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void __thiscall dmlc::JSONWriter::WriteSeperator(JSONWriter *this)

{
  ulong uVar1;
  _Bit_type *p_Var2;
  ostream *poVar3;
  ulong uVar4;
  char local_39;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  p_Var2 = (this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar4 = (ulong)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (((long)p_Var2 -
      (long)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 + uVar4 != 0) {
    uVar1 = uVar4 - 1;
    uVar4 = uVar4 + 0x3e;
    if (-1 < (long)uVar1) {
      uVar4 = uVar1;
    }
    if ((p_Var2[((long)uVar4 >> 6) +
                ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] >> (uVar1 & 0x3f)
        & 1) == 0) {
      return;
    }
  }
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,&local_39,1);
  poVar3 = this->os_;
  local_38 = local_28;
  std::__cxx11::string::_M_construct
            ((ulong)&local_38,
             ((char)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             (char)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * '\x10' +
             (char)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset * '\x02');
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

inline void JSONWriter::WriteSeperator() {
  if (scope_multi_line_.size() == 0 || scope_multi_line_.back()) {
    Extend(os_, '\n');
    Extend(os_, std::string(scope_multi_line_.size() * 2, ' '));
  }
}